

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_function(gravity_parser_t *parser,_Bool is_declaration,gtoken_t access_specifier,
                        gtoken_t storage_specifier)

{
  gravity_lexer_t *pgVar1;
  gtoken_s token_00;
  _Bool _Var2;
  gtoken_t gVar3;
  gtoken_t gVar4;
  char *pcVar5;
  gnode_t *pgVar6;
  gnode_r *pgVar7;
  gnode_t **ppgVar8;
  gnode_t *pgVar9;
  gnode_r *pgVar10;
  size_t sVar11;
  size_t sVar12;
  bool bVar13;
  gtoken_s token;
  _Bool has_default_values;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  char *local_68;
  _Bool local_58;
  undefined7 uStack_57;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_peek(pgVar1);
  gravity_lexer_token(pgVar1);
  if (gVar3 != TOK_OP_OPEN_CURLYBRACE) {
    gVar4 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    local_68 = local_38;
    local_88 = CONCAT71(uStack_57,local_58);
    local_78 = local_48;
    uStack_70 = uStack_40;
    uStack_80 = uStack_50;
    if (gVar4 != TOK_KEY_FUNC) {
      report_error(parser,GRAVITY_ERROR_SYNTAX,0x13faa6);
      return (gnode_t *)0x0;
    }
  }
  if (is_declaration) {
    gVar4 = gravity_lexer_peek(pgVar1);
    _Var2 = token_isoperator(gVar4);
    if (_Var2) {
      gVar4 = gravity_lexer_next(pgVar1);
      pcVar5 = token_name(gVar4);
      pcVar5 = string_dup(pcVar5);
    }
    else {
      pcVar5 = parse_identifier(parser);
    }
  }
  else {
    pcVar5 = (char *)0x0;
  }
  sVar11 = parser->declarations->n;
  if (sVar11 == 0) {
    pgVar6 = (gnode_t *)0x0;
  }
  else {
    pgVar6 = parser->declarations->p[sVar11 - 1];
  }
  token_00.colno = (int)uStack_80;
  token_00.type = (undefined4)local_88;
  token_00.lineno = local_88._4_4_;
  token_00.position = (int)((ulong)uStack_80 >> 0x20);
  token_00.bytes = (int)local_78;
  token_00.length = (int)((ulong)local_78 >> 0x20);
  token_00.fileid = (int)uStack_70;
  token_00.builtin = (int)((ulong)uStack_70 >> 0x20);
  token_00.value = local_68;
  pgVar6 = gnode_function_decl_create
                     (token_00,pcVar5,access_specifier,storage_specifier,(gnode_r *)0x0,
                      (gnode_compound_stmt_t *)0x0,pgVar6);
  if (gVar3 == TOK_OP_OPEN_CURLYBRACE) {
    local_58 = false;
    pgVar7 = parse_optional_parameter_declaration(parser,true,&local_58);
  }
  else {
    parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
    local_58 = false;
    pgVar7 = parse_optional_parameter_declaration(parser,false,&local_58);
    parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
  }
  pgVar10 = parser->declarations;
  sVar11 = pgVar10->n;
  if (sVar11 == pgVar10->m) {
    sVar12 = 8;
    if (sVar11 != 0) {
      sVar12 = sVar11 * 2;
    }
    pgVar10->m = sVar12;
    ppgVar8 = (gnode_t **)realloc(pgVar10->p,sVar12 << 3);
    pgVar10 = parser->declarations;
    pgVar10->p = ppgVar8;
    sVar11 = pgVar10->n;
  }
  else {
    ppgVar8 = pgVar10->p;
  }
  pgVar10->n = sVar11 + 1;
  ppgVar8[sVar11] = pgVar6;
  pgVar9 = parse_compound_statement(parser);
  parser->declarations->n = parser->declarations->n - 1;
  sVar11 = (parser->vdecl).n;
  if (sVar11 == 0) {
    *(undefined1 *)((long)&pgVar6[1].token.value + 5) = 0;
  }
  else {
    bVar13 = (parser->vdecl).p[sVar11 - 1] == 1;
    *(bool *)((long)&pgVar6[1].token.value + 5) = bVar13;
    if (bVar13) goto LAB_0010ef59;
  }
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_peek(pgVar1);
  if (gVar3 == TOK_OP_SEMICOLON) {
    gravity_lexer_next(pgVar1);
  }
LAB_0010ef59:
  *(_Bool *)((long)&pgVar6[1].token.value + 4) = local_58;
  *(gnode_r **)&pgVar6[1].token.bytes = pgVar7;
  *(gnode_t **)&pgVar6[1].token.fileid = pgVar9;
  return pgVar6;
}

Assistant:

gnode_t *parse_function (gravity_parser_t *parser, bool is_declaration, gtoken_t access_specifier, gtoken_t storage_specifier) {
    DECLARE_LEXER;

    // access_specifier? storage_specifier? already parsed
    // 'function' IDENTIFIER '(' parameter_declaration_clause? ')' compound_statement

    // consume FUNC keyword (or peek for OPEN_CURLYBRACE)
    bool is_implicit = (gravity_lexer_peek(lexer) == TOK_OP_OPEN_CURLYBRACE);
    gtoken_s token = gravity_lexer_token(lexer);
    if (!is_implicit) {
        gtoken_t type = gravity_lexer_next(lexer);
        token = gravity_lexer_token(lexer);
        if (type != TOK_KEY_FUNC) {
            REPORT_ERROR(token, "Invalid function expression.");
            return NULL;
        }
    }

    // parse IDENTIFIER
    const char *identifier = NULL;
    if (is_declaration) {
        gtoken_t peek = gravity_lexer_peek(lexer);
        identifier = (token_isoperator(peek)) ? string_dup(token_name(gravity_lexer_next(lexer))) : parse_identifier(parser);
        DEBUG_PARSER("parse_function_declaration %s", identifier);
    }

    // create func declaration node
    gnode_function_decl_t *func = (gnode_function_decl_t *) gnode_function_decl_create(token, identifier, access_specifier, storage_specifier, NULL, NULL, LAST_DECLARATION());

    // check and consume TOK_OP_OPEN_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_OPEN_PARENTHESIS);

    // parse optional parameter declaration clause
    bool has_default_values = false;
    gnode_r *params = parse_optional_parameter_declaration(parser, is_implicit, &has_default_values);

    // check and consume TOK_OP_CLOSED_PARENTHESIS
    if (!is_implicit) parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);

    // parse compound statement
    PUSH_DECLARATION(func);
    gnode_compound_stmt_t *compound = (gnode_compound_stmt_t*)parse_compound_statement(parser);
    POP_DECLARATION();

    // if func is declarared inside a variable declaration node then the semicolon check must be
    // performed once at variable declaration node level ad not inside the func node
    bool is_inside_var_declaration = ((marray_size(parser->vdecl) > 0) && (marray_last(parser->vdecl) == 1));
    func->is_closure = is_inside_var_declaration;
    
    // parse optional semicolon
    if (!is_inside_var_declaration) parse_semicolon(parser);

    // finish func setup
    func->has_defaults = has_default_values;
    func->params = params;
    func->block = compound;
    return (gnode_t *)func;
}